

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

bool __thiscall
wallet::anon_unknown_5::WalletImpl::lockCoin(WalletImpl *this,COutPoint *output,bool write_to_db)

{
  _Head_base<0UL,_wallet::WalletDatabase_*,_false> _Var1;
  bool bVar2;
  _Head_base<0UL,_wallet::WalletBatch_*,_false> batch;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  __uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> local_48;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  if (write_to_db) {
    _Var1._M_head_impl =
         (((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->m_database)._M_t.
         super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
         ._M_t.
         super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
         .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    if (_Var1._M_head_impl == (WalletDatabase *)0x0) {
      __assert_fail("static_cast<bool>(m_database)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                    ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
    }
    batch._M_head_impl = (WalletBatch *)operator_new(0x10);
    (*(_Var1._M_head_impl)->_vptr_WalletDatabase[0xe])(batch._M_head_impl,_Var1._M_head_impl,1);
    *(WalletDatabase **)((long)batch._M_head_impl + 8) = _Var1._M_head_impl;
  }
  else {
    batch._M_head_impl = (WalletBatch *)0x0;
  }
  local_48._M_t.
  super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>.
  super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl =
       (tuple<wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>)
       (tuple<wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>)batch._M_head_impl;
  bVar2 = CWallet::LockCoin((this->m_wallet).
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            output,batch._M_head_impl);
  std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::~unique_ptr
            ((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)&local_48
            );
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool lockCoin(const COutPoint& output, const bool write_to_db) override
    {
        LOCK(m_wallet->cs_wallet);
        std::unique_ptr<WalletBatch> batch = write_to_db ? std::make_unique<WalletBatch>(m_wallet->GetDatabase()) : nullptr;
        return m_wallet->LockCoin(output, batch.get());
    }